

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result * __thiscall
testing::internal::FunctionMocker<ot::commissioner::Error_(ot::commissioner::Channel_&)>::Invoke
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(ot::commissioner::Channel_&)> *this,Channel *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UntypedActionResultHolderBase *pUVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  UntypedActionResultHolderBase *pUVar6;
  long lVar7;
  bool bVar8;
  ArgumentTuple tuple;
  GTestLog local_1c;
  Channel *local_18;
  
  local_18 = args;
  pUVar6 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_18);
  if (pUVar6 == (UntypedActionResultHolderBase *)0x0) {
    bVar8 = true;
  }
  else {
    lVar7 = __dynamic_cast(pUVar6,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<ot::commissioner::Error>::typeinfo,0);
    bVar8 = lVar7 != 0;
  }
  bVar8 = IsTrue(bVar8);
  if (!bVar8) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_1c);
  }
  __return_storage_ptr__->mCode = *(ErrorCode *)&pUVar6[1]._vptr_UntypedActionResultHolderBase;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  pUVar2 = pUVar6 + 4;
  if ((UntypedActionResultHolderBase *)pUVar6[2]._vptr_UntypedActionResultHolderBase == pUVar2) {
    uVar3 = *(undefined4 *)((long)&pUVar6[4]._vptr_UntypedActionResultHolderBase + 4);
    uVar4 = *(undefined4 *)&pUVar6[5]._vptr_UntypedActionResultHolderBase;
    uVar5 = *(undefined4 *)((long)&pUVar6[5]._vptr_UntypedActionResultHolderBase + 4);
    *(undefined4 *)paVar1 = *(undefined4 *)&pUVar2->_vptr_UntypedActionResultHolderBase;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 4) = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 0xc) = uVar5;
  }
  else {
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)pUVar6[2]._vptr_UntypedActionResultHolderBase;
    (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
         (size_type)pUVar2->_vptr_UntypedActionResultHolderBase;
  }
  (__return_storage_ptr__->mMessage)._M_string_length =
       (size_type)pUVar6[3]._vptr_UntypedActionResultHolderBase;
  pUVar6[2]._vptr_UntypedActionResultHolderBase = (_func_int **)pUVar2;
  pUVar6[3]._vptr_UntypedActionResultHolderBase = (_func_int **)0x0;
  *(undefined1 *)&pUVar6[4]._vptr_UntypedActionResultHolderBase = 0;
  if (pUVar6 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar6->_vptr_UntypedActionResultHolderBase[1])(pUVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }